

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall gl4cts::NegativeGLSL::Run(NegativeGLSL *this)

{
  CallLogWrapper *this_00;
  GLuint program;
  long lVar1;
  GLint status;
  bool in_stack_ffffffffffffffd8;
  int local_1c;
  
  lVar1 = 0;
  program = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                       ,(char *)0x0,(char *)0x0,
                       "#version 420 core\nlayout(location = 0) out uvec4 o_color[4];\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter0;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter2;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));\n  o_color[2] = uvec4(atomicCounterIncrement(ac_counter2));\n}"
                       ,(char *)0x0,in_stack_ffffffffffffffd8);
  this->prog_ = program;
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glGetProgramiv(this_00,this->prog_,0x8b82,&local_1c);
  if (local_1c == 1) {
    gl4cts::anon_unknown_0::Output
              (
              "Link should fail because ac_counter0 and ac_counter2 uses same binding and same offset.\n"
              );
    lVar1 = -1;
  }
  return lVar1;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* glsl_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							  "  gl_Position = i_vertex;" NL "}";
		const char* glsl_fs = "#version 420 core" NL "layout(location = 0) out uvec4 o_color[4];" NL
							  "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter0;" NL
							  "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter2;" NL "void main() {" NL
							  "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));" NL
							  "  o_color[2] = uvec4(atomicCounterIncrement(ac_counter2));" NL "}";
		prog_ = CreateProgram(glsl_vs, NULL, NULL, NULL, glsl_fs, false);

		GLint status;
		glLinkProgram(prog_);
		glGetProgramiv(prog_, GL_LINK_STATUS, &status);
		if (status == GL_TRUE)
		{
			Output("Link should fail because ac_counter0 and ac_counter2 uses same binding and same offset.\n");
			return ERROR;
		}
		return NO_ERROR;
	}